

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  string filename_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffee8;
  unsigned_long local_108;
  string filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char *local_98;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  uVar2 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (batchSize == 0) {
    batchSize = uVar2;
  }
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 0;
  for (; uVar2 != 0; uVar2 = uVar2 - uVar3) {
    uVar3 = uVar2;
    if (batchSize < uVar2) {
      uVar3 = batchSize;
    }
    local_90.View_._M_str = (filename_base->_M_dataplus)._M_p;
    local_90.View_._M_len = filename_base->_M_string_length;
    local_60.View_._M_len = 6;
    local_60.View_._M_str = "unity_";
    bVar1 = std::operator==(lang,"C");
    local_98 = "_cxx.cxx";
    if (bVar1) {
      local_98 = "_c.c";
    }
    uVar4 = 0x3327f5;
    cmStrCat<unsigned_long,char_const*>(&filename,&local_90,&local_60,&local_108,&local_98);
    sources.Begin._M_current =
         (filtered_sources->
         super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
         )._M_impl.super__Vector_impl_data._M_start + local_108 * batchSize;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p == &filename.field_2) {
      local_a8._8_8_ = filename.field_2._8_8_;
      local_b8 = &local_a8;
    }
    else {
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)filename._M_dataplus._M_p;
    }
    local_a8._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
    local_a8._M_local_buf[0] = filename.field_2._M_local_buf[0];
    sources.End._M_current = sources.Begin._M_current + uVar3;
    local_b0 = filename._M_string_length;
    filename._M_string_length = 0;
    filename.field_2._M_local_buf[0] = '\0';
    filename_00._M_string_length = uVar4;
    filename_00._M_dataplus._M_p = (pointer)&local_b8;
    filename_00.field_2._M_allocated_capacity = in_stack_fffffffffffffee8;
    filename_00.field_2._8_8_ = __return_storage_ptr__;
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    WriteUnitySource((UnitySource *)&local_90,this,target,configs,sources,beforeInclude,afterInclude
                     ,filename_00);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,(UnitySource *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&filename);
    local_108 = local_108 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string filename = cmStrCat(filename_base, "unity_", batch,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}